

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall dmlc::JSONReader::ReadNumber<long>(JSONReader *this,long *out_value)

{
  ostream *poVar1;
  string sStack_1b8;
  LogMessageFatal local_198;
  
  std::istream::_M_extract<long>((long *)this->is_);
  if (((byte)this->is_[*(long *)(*(long *)this->is_ + -0x18) + 0x20] & 5) != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x2e0);
    poVar1 = std::operator<<((ostream *)&local_198,"Check failed: !is_->fail()");
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"Error at");
    line_info_abi_cxx11_(&sStack_1b8,this);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_1b8);
    std::operator<<(poVar1,", Expect number");
    std::__cxx11::string::~string((string *)&sStack_1b8);
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  return;
}

Assistant:

inline void JSONReader::ReadNumber(ValueType *out_value) {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  *is_ >> *out_value;
  CHECK(!is_->fail())
      << "Error at" << line_info()
      << ", Expect number";
#else
  char *endptr;
  const char *icstr = is_->c_str();
  unsigned number = strtol(icstr, &endptr, 10);
  is_->erase(0, endptr - icstr);
  *out_value = static_cast<ValueType>(number);
#endif
}